

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall HEkkDualRow::computeDevexWeight(HEkkDualRow *this,HighsInt slice)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  long *in_RDI;
  double dVar5;
  double pv;
  HighsInt vr_n;
  HighsInt el_n;
  bool rp_computed_edge_weight;
  int local_14;
  
  in_RDI[0x14] = 0;
  for (local_14 = 0; local_14 < (int)in_RDI[0xd]; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_14);
    iVar1 = *pvVar2;
    pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x2990),
                        (long)iVar1);
    if (*pvVar3 != '\0') {
      iVar1 = *(int *)(in_RDI[6] + (long)iVar1 * 4);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x11),(long)local_14)
      ;
      dVar5 = (double)iVar1 * *pvVar4;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        in_RDI[0x14] = (long)(dVar5 * dVar5 + (double)in_RDI[0x14]);
      }
    }
  }
  return;
}

Assistant:

void HEkkDualRow::computeDevexWeight(const HighsInt slice) {
  const bool rp_computed_edge_weight = false;
  computed_edge_weight = 0;
  for (HighsInt el_n = 0; el_n < packCount; el_n++) {
    HighsInt vr_n = packIndex[el_n];
    if (!ekk_instance_.basis_.nonbasicFlag_[vr_n]) continue;
    double pv = work_devex_index[vr_n] * packValue[el_n];
    if (pv) {
      computed_edge_weight += pv * pv;
    }
  }
  if (rp_computed_edge_weight) {
    if (slice >= 0)
      printf("HEkkDualRow::computeDevexWeight: Slice %1" HIGHSINT_FORMAT
             "; computed_edge_weight = "
             "%11.4g\n",
             slice, computed_edge_weight);
  }
}